

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall
Commands::command_handler_register::Register
          (command_handler_register *this,command_handler *handler,int flags)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  undefined8 uVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_command_handler>_>::value,_pair<iterator,_bool>_>
  _Var5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  local_d0;
  _Base_ptr local_30;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_command_handler>_>::value,_pair<iterator,_bool>_>
  result;
  int flags_local;
  command_handler *handler_local;
  command_handler_register *this_local;
  
  result._12_4_ = flags;
  if ((handler->info).partial_min_chars == 0) {
    (handler->info).partial_min_chars = 1;
  }
  else {
    uVar1 = (handler->info).partial_min_chars;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 < uVar1) {
      sVar3 = std::__cxx11::string::length();
      (handler->info).partial_min_chars = sVar3;
    }
  }
  if ((result._12_4_ & 1) != 0) {
    (handler->info).duty_restrict = true;
  }
  std::make_pair<std::__cxx11::string&,Commands::command_handler&>
            (&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handler,
             handler);
  _Var5 = std::
          map<std::__cxx11::string,Commands::command_handler,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
          ::insert<std::pair<std::__cxx11::string,Commands::command_handler>>
                    ((map<std::__cxx11::string,Commands::command_handler,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
                      *)this,&local_d0);
  local_30 = (_Base_ptr)_Var5.first._M_node;
  result.first._M_node._0_1_ = _Var5.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  ::~pair(&local_d0);
  if (((byte)result.first._M_node & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    Console::Wrn("Duplicate command name: %s",uVar4);
  }
  return;
}

Assistant:

void command_handler_register::Register(command_handler handler, int flags)
{
	if (handler.info.partial_min_chars < 1)
		handler.info.partial_min_chars = 1;
	else if (handler.info.partial_min_chars > handler.info.name.length())
		handler.info.partial_min_chars = handler.info.name.length();

	if (flags & CMD_FLAG_DUTY_RESTRICT)
		handler.info.duty_restrict = true;

	auto result = handlers.insert(std::make_pair(handler.info.name, handler));

	if (!result.second)
		Console::Wrn("Duplicate command name: %s", handler.info.name.c_str());
}